

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcppLibrary.hpp
# Opt level: O1

TToken * __thiscall
tcpp::Lexer::_getNextTokenInternal(TToken *__return_storage_ptr__,Lexer *this,bool ignoreQueue)

{
  TTokensQueue *this_00;
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  size_t sVar3;
  long lVar4;
  undefined7 in_register_00000011;
  string local_48;
  
  if ((int)CONCAT71(in_register_00000011,ignoreQueue) == 0) {
    this_00 = &this->mTokensQueue;
    p_Var1 = (this->mTokensQueue).super__List_base<tcpp::TToken,_std::allocator<tcpp::TToken>_>.
             _M_impl._M_node.super__List_node_base._M_next;
    if (p_Var1 != (_List_node_base *)this_00) {
      __return_storage_ptr__->mType = *(E_TOKEN_TYPE *)&p_Var1[1]._M_next;
      (__return_storage_ptr__->mRawView)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->mRawView).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->mRawView,p_Var1[1]._M_prev,
                 (long)&(p_Var1[1]._M_prev)->_M_next + (long)p_Var1[2]._M_next);
      p_Var2 = p_Var1[4]._M_next;
      __return_storage_ptr__->mLineId = (size_t)p_Var1[3]._M_prev;
      __return_storage_ptr__->mPos = (size_t)p_Var2;
      Catch::clara::std::__cxx11::list<tcpp::TToken,_std::allocator<tcpp::TToken>_>::_M_erase
                (this_00,(this_00->super__List_base<tcpp::TToken,_std::allocator<tcpp::TToken>_>).
                         _M_impl._M_node.super__List_node_base._M_next);
      return __return_storage_ptr__;
    }
  }
  if ((this->mCurrLine)._M_string_length == 0) {
    _requestSourceLine_abi_cxx11_(&local_48,this);
    lVar4 = std::__cxx11::string::operator=((string *)&this->mCurrLine,(string *)&local_48);
    lVar4 = *(long *)(lVar4 + 8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if (lVar4 == 0) {
      __return_storage_ptr__->mType = mEOFToken;
      (__return_storage_ptr__->mRawView)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->mRawView).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->mRawView,DAT_001c5e10,
                 DAT_001c5e18 + DAT_001c5e10);
      sVar3 = sRam00000000001c5e38;
      __return_storage_ptr__->mLineId = _DAT_001c5e30;
      __return_storage_ptr__->mPos = sVar3;
      return __return_storage_ptr__;
    }
  }
  _scanTokens(__return_storage_ptr__,this,&this->mCurrLine);
  return __return_storage_ptr__;
}

Assistant:

TToken Lexer::_getNextTokenInternal(bool ignoreQueue) TCPP_NOEXCEPT
	{
		if (!ignoreQueue && !mTokensQueue.empty())
		{
			auto currToken = mTokensQueue.front();
			mTokensQueue.pop_front();

			return currToken;
		}

		if (mCurrLine.empty())
		{
			// \note if it's still empty then we've reached the end of the source
			if ((mCurrLine = _requestSourceLine()).empty())
			{
				return mEOFToken;
			}
		}

		return _scanTokens(mCurrLine);
	}